

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

void __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::initializeMemorySizes
          (ModuleRunnerBase<wasm::ModuleRunner> *this)

{
  pointer puVar1;
  Memory *__k;
  mapped_type *pmVar2;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *memory;
  pointer puVar3;
  
  puVar3 = (this->wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar3 != puVar1) {
    do {
      __k = (puVar3->_M_t).super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
            _M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
            super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
      pmVar2 = std::__detail::
               _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Address>,_std::allocator<std::pair<const_wasm::Name,_wasm::Address>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Address>,_std::allocator<std::pair<const_wasm::Name,_wasm::Address>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&this->memorySizes,(key_type *)__k);
      pmVar2->addr = (__k->initial).addr;
      puVar3 = puVar3 + 1;
    } while (puVar3 != puVar1);
  }
  return;
}

Assistant:

void initializeMemorySizes() {
    for (auto& memory : wasm.memories) {
      memorySizes[memory->name] = memory->initial;
    }
  }